

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakeLanguageCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_505d77::cmCMakeLanguageCommandCALL
               (vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *args,
               string *callCommand,size_t startArg,optional<(anonymous_namespace)::Defer> *defer,
               cmExecutionStatus *status)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  undefined8 uVar2;
  undefined8 status_00;
  bool bVar3;
  const_iterator pvVar4;
  const_iterator __last;
  static_string_view *psVar5;
  const_iterator pvVar6;
  const_iterator __last_00;
  cmListFileContext *pcVar7;
  size_type sVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  const_reference __args;
  const_reference pvVar10;
  ulong uVar11;
  Defer *pDVar12;
  Defer *this;
  string *b;
  static_string_view sVar13;
  string_view value;
  cmMakefile *local_378;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2b0;
  string_view local_288;
  string_view local_278;
  string local_268;
  cmListFileFunction local_248;
  string local_238;
  string local_218;
  cmMakefile *local_1f8;
  cmMakefile *deferMakefile;
  char *local_1e8;
  string local_1e0;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> local_1c0;
  string local_1a8;
  undefined1 local_188 [8];
  cmListFileFunction func;
  size_t i;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> funcArgs;
  undefined1 local_148 [8];
  cmListFileContext context;
  cmMakefile *makefile;
  char *local_c8;
  string local_c0;
  undefined4 local_9c;
  string_view local_98;
  string local_88;
  undefined1 local_58 [8];
  string cmd;
  cmExecutionStatus *status_local;
  optional<(anonymous_namespace)::Defer> *defer_local;
  size_t startArg_local;
  string *callCommand_local;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *args_local;
  
  cmd.field_2._8_8_ = status;
  cmsys::SystemTools::LowerCase((string *)local_58,callCommand);
  pvVar4 = std::array<cm::static_string_view,_14UL>::cbegin
                     ((array<cm::static_string_view,_14UL> *)(anonymous_namespace)::InvalidCommands)
  ;
  __last = std::array<cm::static_string_view,_14UL>::cend
                     ((array<cm::static_string_view,_14UL> *)(anonymous_namespace)::InvalidCommands)
  ;
  psVar5 = std::find<cm::static_string_view_const*,std::__cxx11::string>
                     (pvVar4,__last,(string *)local_58);
  pvVar4 = std::array<cm::static_string_view,_14UL>::cend
                     ((array<cm::static_string_view,_14UL> *)(anonymous_namespace)::InvalidCommands)
  ;
  uVar2 = cmd.field_2._8_8_;
  if (psVar5 == pvVar4) {
    bVar3 = std::optional::operator_cast_to_bool((optional *)defer);
    if (bVar3) {
      pvVar6 = std::array<cm::static_string_view,_1UL>::cbegin
                         ((array<cm::static_string_view,_1UL> *)
                          (anonymous_namespace)::InvalidDeferCommands);
      __last_00 = std::array<cm::static_string_view,_1UL>::cend
                            ((array<cm::static_string_view,_1UL> *)
                             (anonymous_namespace)::InvalidDeferCommands);
      psVar5 = std::find<cm::static_string_view_const*,std::__cxx11::string>
                         (pvVar6,__last_00,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_58);
      pvVar6 = std::array<cm::static_string_view,_1UL>::cend
                         ((array<cm::static_string_view,_1UL> *)
                          (anonymous_namespace)::InvalidDeferCommands);
      uVar2 = cmd.field_2._8_8_;
      if (psVar5 != pvVar6) {
        sVar13 = ::cm::operator____s("invalid command specified: ",0x1b);
        local_c8 = sVar13.super_string_view._M_str;
        makefile = (cmMakefile *)sVar13.super_string_view._M_len;
        cmStrCat<cm::static_string_view,std::__cxx11::string_const&>
                  (&local_c0,(static_string_view *)&makefile,callCommand);
        args_local._7_1_ = FatalError((cmExecutionStatus *)uVar2,&local_c0);
        std::__cxx11::string::~string((string *)&local_c0);
        local_9c = 1;
        goto LAB_0040742e;
      }
    }
    context.DeferId.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._32_8_ = cmExecutionStatus::GetMakefile((cmExecutionStatus *)cmd.field_2._8_8_);
    cmMakefile::GetBacktrace
              ((cmMakefile *)
               &funcArgs.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pcVar7 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Top
                       ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)
                        &funcArgs.
                         super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    cmListFileContext::cmListFileContext((cmListFileContext *)local_148,pcVar7);
    cmListFileBacktrace::~cmListFileBacktrace
              ((cmListFileBacktrace *)
               &funcArgs.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::vector
              ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)&i);
    sVar8 = std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::size(args);
    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::reserve
              ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)&i,
               sVar8 - startArg);
    for (func.Impl.
         super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)startArg;
        _Var1._M_pi = func.Impl.
                      super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi,
        p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::size(args),
        _Var1._M_pi < p_Var9;
        func.Impl.
        super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&(func.Impl.
                      super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1)) {
      __args = std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::operator[]
                         (args,(size_type)
                               func.Impl.
                               super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi);
      pvVar10 = std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::operator[]
                          (args,(size_type)
                                func.Impl.
                                super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi);
      std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
      emplace_back<std::__cxx11::string_const&,cmListFileArgument::Delimiter_const&,long&>
                ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)&i,&__args->Value,
                 &pvVar10->Delim,(long *)(context.FilePath.field_2._M_local_buf + 8));
    }
    std::__cxx11::string::string((string *)&local_1a8,(string *)callCommand);
    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::vector
              (&local_1c0,(vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)&i);
    cmListFileFunction::cmListFileFunction
              ((cmListFileFunction *)local_188,&local_1a8,context.FilePath.field_2._8_8_,
               context.FilePath.field_2._8_8_,&local_1c0);
    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector(&local_1c0);
    std::__cxx11::string::~string((string *)&local_1a8);
    bVar3 = std::optional::operator_cast_to_bool((optional *)defer);
    status_00 = cmd.field_2._8_8_;
    uVar2 = context.DeferId.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._32_8_;
    if (bVar3) {
      std::optional<(anonymous_namespace)::Defer>::operator->(defer);
      uVar11 = std::__cxx11::string::empty();
      if ((uVar11 & 1) != 0) {
        cmMakefile::NewDeferId_abi_cxx11_
                  (&local_1e0,
                   (cmMakefile *)
                   context.DeferId.
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ._32_8_);
        pDVar12 = std::optional<(anonymous_namespace)::Defer>::operator->(defer);
        std::__cxx11::string::operator=((string *)pDVar12,(string *)&local_1e0);
        std::__cxx11::string::~string((string *)&local_1e0);
      }
      std::optional<(anonymous_namespace)::Defer>::operator->(defer);
      uVar11 = std::__cxx11::string::empty();
      uVar2 = context.DeferId.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._32_8_;
      if ((uVar11 & 1) == 0) {
        pDVar12 = std::optional<(anonymous_namespace)::Defer>::operator->(defer);
        this = std::optional<(anonymous_namespace)::Defer>::operator->(defer);
        value = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)this);
        local_1e8 = value._M_str;
        deferMakefile = (cmMakefile *)value._M_len;
        cmMakefile::AddDefinition((cmMakefile *)uVar2,&pDVar12->IdVar,value);
      }
      pDVar12 = std::optional<(anonymous_namespace)::Defer>::operator->(defer);
      if (pDVar12->Directory == (cmMakefile *)0x0) {
        local_378 = (cmMakefile *)
                    context.DeferId.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._32_8_;
      }
      else {
        pDVar12 = std::optional<(anonymous_namespace)::Defer>::operator->(defer);
        local_378 = pDVar12->Directory;
      }
      local_1f8 = local_378;
      pDVar12 = std::optional<(anonymous_namespace)::Defer>::operator->(defer);
      std::__cxx11::string::string((string *)&local_218,(string *)pDVar12);
      std::__cxx11::string::string
                ((string *)&local_238,(string *)(context.Name.field_2._M_local_buf + 8));
      cmListFileFunction::cmListFileFunction(&local_248,(cmListFileFunction *)local_188);
      bVar3 = cmMakefile::DeferCall(local_378,&local_218,&local_238,&local_248);
      cmListFileFunction::~cmListFileFunction(&local_248);
      std::__cxx11::string::~string((string *)&local_238);
      std::__cxx11::string::~string((string *)&local_218);
      uVar2 = cmd.field_2._8_8_;
      if (((bVar3 ^ 0xffU) & 1) == 0) {
        args_local._7_1_ = true;
      }
      else {
        local_278 = (string_view)
                    ::cm::operator____s("DEFER CALL may not be scheduled in directory:\n  ",0x30);
        b = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(local_1f8);
        local_288 = (string_view)::cm::operator____s("\nat this time.",0xe);
        cmStrCat<cm::static_string_view,std::__cxx11::string_const&,cm::static_string_view>
                  (&local_268,(static_string_view *)&local_278,b,(static_string_view *)&local_288);
        args_local._7_1_ = FatalError((cmExecutionStatus *)uVar2,&local_268);
        std::__cxx11::string::~string((string *)&local_268);
      }
    }
    else {
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional(&local_2b0);
      args_local._7_1_ =
           cmMakefile::ExecuteCommand
                     ((cmMakefile *)uVar2,(cmListFileFunction *)local_188,
                      (cmExecutionStatus *)status_00,&local_2b0);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~optional(&local_2b0);
    }
    local_9c = 1;
    cmListFileFunction::~cmListFileFunction((cmListFileFunction *)local_188);
    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector
              ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)&i);
    cmListFileContext::~cmListFileContext((cmListFileContext *)local_148);
  }
  else {
    local_98 = (string_view)::cm::operator____s("invalid command specified: ",0x1b);
    cmStrCat<cm::static_string_view,std::__cxx11::string_const&>
              (&local_88,(static_string_view *)&local_98,callCommand);
    args_local._7_1_ = FatalError((cmExecutionStatus *)uVar2,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    local_9c = 1;
  }
LAB_0040742e:
  std::__cxx11::string::~string((string *)local_58);
  return args_local._7_1_;
}

Assistant:

bool cmCMakeLanguageCommandCALL(std::vector<cmListFileArgument> const& args,
                                std::string const& callCommand,
                                size_t startArg, cm::optional<Defer> defer,
                                cmExecutionStatus& status)
{
  // ensure specified command is valid
  // start/end flow control commands are not allowed
  auto cmd = cmSystemTools::LowerCase(callCommand);
  if (std::find(InvalidCommands.cbegin(), InvalidCommands.cend(), cmd) !=
      InvalidCommands.cend()) {
    return FatalError(status,
                      cmStrCat("invalid command specified: "_s, callCommand));
  }
  if (defer &&
      std::find(InvalidDeferCommands.cbegin(), InvalidDeferCommands.cend(),
                cmd) != InvalidDeferCommands.cend()) {
    return FatalError(status,
                      cmStrCat("invalid command specified: "_s, callCommand));
  }

  cmMakefile& makefile = status.GetMakefile();
  cmListFileContext context = makefile.GetBacktrace().Top();

  std::vector<cmListFileArgument> funcArgs;
  funcArgs.reserve(args.size() - startArg);

  // The rest of the arguments are passed to the function call above
  for (size_t i = startArg; i < args.size(); ++i) {
    funcArgs.emplace_back(args[i].Value, args[i].Delim, context.Line);
  }
  cmListFileFunction func{ callCommand, context.Line, context.Line,
                           std::move(funcArgs) };

  if (defer) {
    if (defer->Id.empty()) {
      defer->Id = makefile.NewDeferId();
    }
    if (!defer->IdVar.empty()) {
      makefile.AddDefinition(defer->IdVar, defer->Id);
    }
    cmMakefile* deferMakefile =
      defer->Directory ? defer->Directory : &makefile;
    if (!deferMakefile->DeferCall(defer->Id, context.FilePath, func)) {
      return FatalError(
        status,
        cmStrCat("DEFER CALL may not be scheduled in directory:\n  "_s,
                 deferMakefile->GetCurrentBinaryDirectory(),
                 "\nat this time."_s));
    }
    return true;
  }
  return makefile.ExecuteCommand(func, status);
}